

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,uint args,uchar args_1,unsigned_short args_2,unsigned_short args_3,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  UntypedActionResultHolderBase *pUVar5;
  long lVar6;
  UntypedActionResultHolderBase *pUVar7;
  bool bVar8;
  GTestLog local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  unsigned_short local_28;
  unsigned_short local_26;
  uchar local_24;
  uint local_20;
  
  local_30 = args_4;
  local_28 = args_3;
  local_26 = args_2;
  local_24 = args_1;
  local_20 = args;
  pUVar5 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_30);
  if (pUVar5 == (UntypedActionResultHolderBase *)0x0) {
    bVar8 = true;
  }
  else {
    lVar6 = __dynamic_cast(pUVar5,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<ot::commissioner::Error>::typeinfo,0);
    bVar8 = lVar6 != 0;
  }
  bVar8 = IsTrue(bVar8);
  if (!bVar8) {
    GTestLog::GTestLog(&local_34,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_34);
  }
  __return_storage_ptr__->mCode = *(ErrorCode *)&pUVar5[1]._vptr_UntypedActionResultHolderBase;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  pUVar7 = pUVar5 + 4;
  if ((UntypedActionResultHolderBase *)pUVar5[2]._vptr_UntypedActionResultHolderBase == pUVar7) {
    uVar2 = *(undefined4 *)((long)&pUVar5[4]._vptr_UntypedActionResultHolderBase + 4);
    uVar3 = *(undefined4 *)&pUVar5[5]._vptr_UntypedActionResultHolderBase;
    uVar4 = *(undefined4 *)((long)&pUVar5[5]._vptr_UntypedActionResultHolderBase + 4);
    *(undefined4 *)paVar1 = *(undefined4 *)&pUVar7->_vptr_UntypedActionResultHolderBase;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 4) = uVar2;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 0xc) = uVar4;
  }
  else {
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)pUVar5[2]._vptr_UntypedActionResultHolderBase;
    (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
         (size_type)pUVar7->_vptr_UntypedActionResultHolderBase;
  }
  (__return_storage_ptr__->mMessage)._M_string_length =
       (size_type)pUVar5[3]._vptr_UntypedActionResultHolderBase;
  pUVar5[2]._vptr_UntypedActionResultHolderBase = (_func_int **)pUVar7;
  pUVar5[3]._vptr_UntypedActionResultHolderBase = (_func_int **)0x0;
  *(undefined1 *)&pUVar5[4]._vptr_UntypedActionResultHolderBase = 0;
  (*pUVar5->_vptr_UntypedActionResultHolderBase[1])(pUVar5);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }